

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O0

void EBML_MasterSort(ebml_master *Element,arraycmp Cmp,void *CmpParam)

{
  long lVar1;
  undefined8 uVar2;
  ebml_element *local_48;
  ebml_element **j;
  ebml_element *i;
  array Elts;
  void *CmpParam_local;
  arraycmp Cmp_local;
  ebml_master *Element_local;
  
  i = (ebml_element *)0x0;
  Elts._Begin = (char *)0x0;
  j = (ebml_element **)(Element->Base).Base.Children;
  Elts._Used = (size_t)CmpParam;
  while( true ) {
    if (j == (ebml_element **)0x0) {
      if (Cmp == (arraycmp)0x0) {
        ArraySortEx((array *)&i,(ulong)Elts._Begin >> 3,8,EbmlCmp,Element,0);
      }
      else {
        ArraySortEx((array *)&i,(ulong)Elts._Begin >> 3,8,Cmp,(void *)Elts._Used,0);
      }
      EBML_MasterClear(Element);
      j = (ebml_element **)0x0;
      local_48 = i;
      while( true ) {
        if (local_48 ==
            (ebml_element *)
            ((long)&(i->Base).Base.FourCC + ((ulong)Elts._Begin & 0xfffffffffffffff8))) {
          ArrayClear((array *)&i);
          return;
        }
        lVar1._0_4_ = (local_48->Base).Base.FourCC;
        lVar1._4_4_ = (local_48->Base).Base.Magic;
        if (lVar1 == 0) break;
        uVar2._0_4_ = (local_48->Base).Base.FourCC;
        uVar2._4_4_ = (local_48->Base).Base.Magic;
        (**(code **)(*(long *)(*(long *)&(local_48->Base).Base + 8) + 0x48))(uVar2,Element,0);
        j = *(ebml_element ***)&(local_48->Base).Base;
        local_48 = (ebml_element *)&(local_48->Base).Base.VMT;
      }
      __assert_fail("(const void*)(*j)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x84,"void EBML_MasterSort(ebml_master *, arraycmp, const void *)");
    }
    ArrayAppend((array *)&i,&j,8,0x40);
    if ((ebml_element *)j == j[5]) break;
    j = (ebml_element **)j[5];
  }
  __assert_fail("(nodetree*)(i) != ((nodetree*)(i))->Next",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                ,0x78,"void EBML_MasterSort(ebml_master *, arraycmp, const void *)");
}

Assistant:

void EBML_MasterSort(ebml_master *Element, arraycmp Cmp, const void* CmpParam)
{
    array Elts;
    ebml_element *i,**j;
    ArrayInit(&Elts);
    for (i=EBML_MasterChildren(Element);i;i=EBML_MasterNext(i))
        ArrayAppend(&Elts,&i,sizeof(i),64);
    if (Cmp)
        ArraySort(&Elts,ebml_element*,Cmp,CmpParam,0);
    else
        ArraySort(&Elts,ebml_element*,EbmlCmp,Element,0);

    // refill the master with the new order
    EBML_MasterClear(Element);
    i = NULL;
    for (j=ARRAYBEGIN(Elts,ebml_element*);j!=ARRAYEND(Elts,ebml_element*);++j)
    {
        NodeTree_SetParent(*j,Element,NULL);
        i = *j;
    }
    ArrayClear(&Elts);
}